

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_intersect.h
# Opt level: O0

result crnlib::intersection::
       ray_aabb<crnlib::vec<3u,float>,float,crnlib::ray<crnlib::vec<3u,float>>,crnlib::vec_interval<crnlib::vec<3u,float>>>
                 (vec<3U,_float> *coord,float *t,ray<crnlib::vec<3U,_float>_> *ray,
                 vec_interval<crnlib::vec<3U,_float>_> *box)

{
  vec<3U,_float> *pvVar1;
  float *pfVar2;
  vec_interval<crnlib::vec<3U,_float>_> *in_RCX;
  ray<crnlib::vec<3U,_float>_> *in_RDX;
  float *in_RSI;
  vec<3U,_float> *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  int i_3;
  int i_2;
  int which_plane;
  int i_1;
  float max_t [3];
  int i;
  float candidate_plane [3];
  int quadrant [3];
  bool inside;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  float afStack_54 [3];
  uint local_48;
  float afStack_44 [3];
  int aiStack_38 [3];
  byte local_29;
  vec_interval<crnlib::vec<3U,_float>_> *local_28;
  ray<crnlib::vec<3U,_float>_> *local_20;
  float *local_18;
  vec<3U,_float> *local_10;
  result local_4;
  
  local_29 = 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  for (local_48 = 0; (int)local_48 < 3; local_48 = local_48 + 1) {
    pvVar1 = ray<crnlib::vec<3U,_float>_>::get_origin(local_20);
    fVar3 = vec<3U,_float>::operator[](pvVar1,local_48);
    pvVar1 = vec_interval<crnlib::vec<3U,_float>_>::operator[](local_28,0);
    fVar4 = vec<3U,_float>::operator[](pvVar1,local_48);
    if (fVar4 <= fVar3) {
      pvVar1 = ray<crnlib::vec<3U,_float>_>::get_origin(local_20);
      fVar3 = vec<3U,_float>::operator[](pvVar1,local_48);
      pvVar1 = vec_interval<crnlib::vec<3U,_float>_>::operator[](local_28,1);
      fVar4 = vec<3U,_float>::operator[](pvVar1,local_48);
      if (fVar3 <= fVar4) {
        aiStack_38[(int)local_48] = 2;
      }
      else {
        aiStack_38[(int)local_48] = 0;
        pvVar1 = vec_interval<crnlib::vec<3U,_float>_>::operator[](local_28,1);
        fVar3 = vec<3U,_float>::operator[](pvVar1,local_48);
        afStack_44[(int)local_48] = fVar3;
        local_29 = 0;
      }
    }
    else {
      aiStack_38[(int)local_48] = 1;
      pvVar1 = vec_interval<crnlib::vec<3U,_float>_>::operator[](local_28,0);
      fVar3 = vec<3U,_float>::operator[](pvVar1,local_48);
      afStack_44[(int)local_48] = fVar3;
      local_29 = 0;
    }
  }
  if ((local_29 & 1) == 0) {
    for (local_58 = 0; (int)local_58 < 3; local_58 = local_58 + 1) {
      if (aiStack_38[(int)local_58] == 2) {
LAB_001e1c01:
        afStack_54[(int)local_58] = -1.0;
      }
      else {
        pvVar1 = ray<crnlib::vec<3U,_float>_>::get_direction(local_20);
        fVar3 = vec<3U,_float>::operator[](pvVar1,local_58);
        if ((fVar3 == 0.0) && (!NAN(fVar3))) goto LAB_001e1c01;
        fVar3 = afStack_44[(int)local_58];
        pvVar1 = ray<crnlib::vec<3U,_float>_>::get_origin(local_20);
        fVar4 = vec<3U,_float>::operator[](pvVar1,local_58);
        pvVar1 = ray<crnlib::vec<3U,_float>_>::get_direction(local_20);
        fVar5 = vec<3U,_float>::operator[](pvVar1,local_58);
        afStack_54[(int)local_58] = (fVar3 - fVar4) / fVar5;
      }
    }
    local_5c = 0;
    for (local_60 = 1; (int)local_60 < 3; local_60 = local_60 + 1) {
      if (afStack_54[(int)local_5c] < afStack_54[(int)local_60]) {
        local_5c = local_60;
      }
    }
    if (0.0 < afStack_54[(int)local_5c] || afStack_54[(int)local_5c] == 0.0) {
      for (local_64 = 0; (int)local_64 < 3; local_64 = local_64 + 1) {
        if (local_64 == local_5c) {
          fVar3 = afStack_44[(int)local_64];
          pfVar2 = vec<3U,_float>::operator[](local_10,local_64);
          *pfVar2 = fVar3;
        }
        else {
          pvVar1 = ray<crnlib::vec<3U,_float>_>::get_origin(local_20);
          fVar4 = vec<3U,_float>::operator[](pvVar1,local_64);
          fVar3 = afStack_54[(int)local_5c];
          pvVar1 = ray<crnlib::vec<3U,_float>_>::get_direction(local_20);
          fVar5 = vec<3U,_float>::operator[](pvVar1,local_64);
          pfVar2 = vec<3U,_float>::operator[](local_10,local_64);
          *pfVar2 = fVar4 + fVar3 * fVar5;
          pfVar2 = vec<3U,_float>::operator[](local_10,local_64);
          fVar3 = *pfVar2;
          pvVar1 = vec_interval<crnlib::vec<3U,_float>_>::operator[](local_28,0);
          fVar4 = vec<3U,_float>::operator[](pvVar1,local_64);
          if (fVar3 < fVar4) {
            return cFailure;
          }
          pfVar2 = vec<3U,_float>::operator[](local_10,local_64);
          fVar3 = *pfVar2;
          pvVar1 = vec_interval<crnlib::vec<3U,_float>_>::operator[](local_28,1);
          fVar4 = vec<3U,_float>::operator[](pvVar1,local_64);
          if (fVar4 < fVar3) {
            return cFailure;
          }
        }
      }
      *local_18 = afStack_54[(int)local_5c];
      local_4 = cSuccess;
    }
    else {
      local_4 = cFailure;
    }
  }
  else {
    pvVar1 = ray<crnlib::vec<3U,_float>_>::get_origin(local_20);
    vec<3U,_float>::operator=(local_10,pvVar1);
    *local_18 = 0.0;
    local_4 = cInside;
  }
  return local_4;
}

Assistant:

result ray_aabb(vector_type& coord, scalar_type& t, const ray_type& ray, const aabb_type& box) {
  enum {
    cNumDim = vector_type::num_elements,
    cRight = 0,
    cLeft = 1,
    cMiddle = 2
  };

  bool inside = true;
  int quadrant[cNumDim];
  scalar_type candidate_plane[cNumDim];

  for (int i = 0; i < cNumDim; i++) {
    if (ray.get_origin()[i] < box[0][i]) {
      quadrant[i] = cLeft;
      candidate_plane[i] = box[0][i];
      inside = false;
    } else if (ray.get_origin()[i] > box[1][i]) {
      quadrant[i] = cRight;
      candidate_plane[i] = box[1][i];
      inside = false;
    } else {
      quadrant[i] = cMiddle;
    }
  }

  if (inside) {
    coord = ray.get_origin();
    t = 0.0f;
    return cInside;
  }

  scalar_type max_t[cNumDim];
  for (int i = 0; i < cNumDim; i++) {
    if ((quadrant[i] != cMiddle) && (ray.get_direction()[i] != 0.0f))
      max_t[i] = (candidate_plane[i] - ray.get_origin()[i]) / ray.get_direction()[i];
    else
      max_t[i] = -1.0f;
  }

  int which_plane = 0;
  for (int i = 1; i < cNumDim; i++)
    if (max_t[which_plane] < max_t[i])
      which_plane = i;

  if (max_t[which_plane] < 0.0f)
    return cFailure;

  for (int i = 0; i < cNumDim; i++) {
    if (i != which_plane) {
      coord[i] = ray.get_origin()[i] + max_t[which_plane] * ray.get_direction()[i];

      if ((coord[i] < box[0][i]) || (coord[i] > box[1][i]))
        return cFailure;
    } else {
      coord[i] = candidate_plane[i];
    }

    CRNLIB_ASSERT(coord[i] >= box[0][i] && coord[i] <= box[1][i]);
  }

  t = max_t[which_plane];
  return cSuccess;
}